

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O3

bool isParamValid(char *p,uint64_t *value)

{
  size_t sVar1;
  __integer_from_chars_result_type<unsigned_long> _Var2;
  
  sVar1 = strlen(p);
  _Var2 = std::from_chars<unsigned_long>(p,p + sVar1,value,10);
  if (_Var2.ec != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: wrong parameter type: ",0x1d);
    if (p == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x128228);
    }
    else {
      sVar1 = strlen(p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,p,sVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  return _Var2.ec == 0;
}

Assistant:

static bool isParamValid(char const* p, uint64_t& value) {
  auto result = std::from_chars(p, p + strlen(p), value);
  if (result.ec != std::errc()) {
    std::cerr << "Error: wrong parameter type: " << p << std::endl;
    return false;
  }
  return true;
}